

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool anon_unknown.dwarf_14a7c50::cmRt2CtSelector<std::logical_and,_std::logical_or>::eval<bool>
               (int r,bool lhs,bool rhs)

{
  logical_and<bool> local_13;
  bool local_12;
  bool local_11;
  int local_10;
  bool rhs_local;
  bool lhs_local;
  int r_local;
  
  if (r == 0) {
    lhs_local = false;
  }
  else {
    local_12 = rhs;
    local_11 = lhs;
    local_10 = r;
    if (r == 1) {
      lhs_local = std::logical_and<bool>::operator()(&local_13,&local_11,&local_12);
    }
    else {
      lhs_local = cmRt2CtSelector<std::logical_or>::eval<bool>(r + -1,lhs,rhs);
    }
  }
  return lhs_local;
}

Assistant:

static bool eval(int r, T lhs, T rhs)
  {
    switch (r) {
      case 0:
        return false;
      case 1:
        return Comp<T>()(lhs, rhs);
      default:
        return cmRt2CtSelector<Ops...>::eval(r - 1, lhs, rhs);
    }
  }